

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_gtk.cxx
# Opt level: O1

void gtk_thin_up_box(int x,int y,int w,int h,Fl_Color c)

{
  Fl_Color FVar1;
  uint uVar2;
  uint uVar3;
  
  gtk_thin_up_frame(x,y,w,h,c);
  FVar1 = fl_color_average(0xff,c,0.4);
  Fl::set_box_color(FVar1);
  uVar3 = x + 1;
  uVar2 = (w + x) - 2;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
            (fl_graphics_driver,(ulong)uVar3,(ulong)(y + 1),(ulong)uVar2);
  FVar1 = fl_color_average(0xff,c,0.2);
  Fl::set_box_color(FVar1);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
            (fl_graphics_driver,(ulong)uVar3,(ulong)(y + 2),(ulong)uVar2);
  FVar1 = fl_color_average(0xff,c,0.1);
  Fl::set_box_color(FVar1);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
            (fl_graphics_driver,(ulong)uVar3,(ulong)(y + 3),(ulong)uVar2);
  Fl::set_box_color(c);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
            (fl_graphics_driver,(ulong)uVar3,(ulong)(y + 4),(ulong)(w - 2),(ulong)(h - 8));
  FVar1 = fl_color_average(0x38,c,0.025);
  Fl::set_box_color(FVar1);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
            (fl_graphics_driver,(ulong)uVar3,(ulong)((y + h) - 4),(ulong)uVar2);
  FVar1 = fl_color_average(0x38,c,0.05);
  Fl::set_box_color(FVar1);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
            (fl_graphics_driver,(ulong)uVar3,(ulong)((y + h) - 3),(ulong)uVar2);
  FVar1 = fl_color_average(0x38,c,0.1);
  Fl::set_box_color(FVar1);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
            (fl_graphics_driver,(ulong)uVar3,(ulong)((y + h) - 2),(ulong)uVar2);
  return;
}

Assistant:

static void gtk_thin_up_box(int x, int y, int w, int h, Fl_Color c) {
  gtk_thin_up_frame(x, y, w, h, c);

  gtk_color(fl_color_average(FL_WHITE, c, 0.4f));
  fl_xyline(x + 1, y + 1, x + w - 2);
  gtk_color(fl_color_average(FL_WHITE, c, 0.2f));
  fl_xyline(x + 1, y + 2, x + w - 2);
  gtk_color(fl_color_average(FL_WHITE, c, 0.1f));
  fl_xyline(x + 1, y + 3, x + w - 2);
  gtk_color(c);
  fl_rectf(x + 1, y + 4, w - 2, h - 8);
  gtk_color(fl_color_average(FL_BLACK, c, 0.025f));
  fl_xyline(x + 1, y + h - 4, x + w - 2);
  gtk_color(fl_color_average(FL_BLACK, c, 0.05f));
  fl_xyline(x + 1, y + h - 3, x + w - 2);
  gtk_color(fl_color_average(FL_BLACK, c, 0.1f));
  fl_xyline(x + 1, y + h - 2, x + w - 2);
}